

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bigint.h
# Opt level: O0

bool __thiscall fast_float::bigint::shl_bits(bigint *this,size_t n)

{
  limb lVar1;
  size_t sVar2;
  limb *plVar3;
  ulong value;
  byte bVar4;
  limb carry;
  limb xi;
  size_t index;
  limb prev;
  size_t shr;
  size_t shl;
  size_t n_local;
  bigint *this_local;
  
  bVar4 = 0x40 - (byte)n;
  index = 0;
  xi = 0;
  while( true ) {
    sVar2 = stackvec<(unsigned_short)62>::len(&this->vec);
    if (sVar2 <= xi) break;
    plVar3 = stackvec<(unsigned_short)62>::operator[](&this->vec,xi);
    lVar1 = *plVar3;
    plVar3 = stackvec<(unsigned_short)62>::operator[](&this->vec,xi);
    *plVar3 = lVar1 << ((byte)n & 0x3f) | index >> (bVar4 & 0x3f);
    xi = xi + 1;
    index = lVar1;
  }
  value = index >> (bVar4 & 0x3f);
  if (value == 0) {
    this_local._7_1_ = true;
  }
  else {
    this_local._7_1_ = stackvec<(unsigned_short)62>::try_push(&this->vec,value);
  }
  return this_local._7_1_;
}

Assistant:

FASTFLOAT_CONSTEXPR20 bool shl_bits(size_t n) noexcept {
    // Internally, for each item, we shift left by n, and add the previous
    // right shifted limb-bits.
    // For example, we transform (for u8) shifted left 2, to:
    //      b10100100 b01000010
    //      b10 b10010001 b00001000
    FASTFLOAT_DEBUG_ASSERT(n != 0);
    FASTFLOAT_DEBUG_ASSERT(n < sizeof(limb) * 8);

    size_t shl = n;
    size_t shr = limb_bits - shl;
    limb prev = 0;
    for (size_t index = 0; index < vec.len(); index++) {
      limb xi = vec[index];
      vec[index] = (xi << shl) | (prev >> shr);
      prev = xi;
    }

    limb carry = prev >> shr;
    if (carry != 0) {
      return vec.try_push(carry);
    }
    return true;
  }